

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  long lVar1;
  size_t sVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string file_name;
  int local_a4;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  long *local_80;
  undefined8 local_78;
  long local_70;
  undefined8 uStack_68;
  string local_60;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_a4 = (int)file;
  if (this == (internal *)0x0) {
    this = (internal *)"unknown file";
  }
  local_40 = local_30;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,this,this + sVar2);
  if (local_a4 < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_40,local_38 + (long)local_40);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_00116463;
  }
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_40,local_38 + (long)local_40);
  std::__cxx11::string::append((char *)&local_a0);
  StreamableToString<int>(&local_60,&local_a4);
  uVar6 = 0xf;
  if (local_a0 != local_90) {
    uVar6 = local_90[0];
  }
  if (uVar6 < local_60._M_string_length + local_98) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      uVar7 = local_60.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_60._M_string_length + local_98) goto LAB_00116335;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_a0);
  }
  else {
LAB_00116335:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60._M_dataplus._M_p);
  }
  local_80 = &local_70;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_70 = *plVar4;
    uStack_68 = puVar3[3];
  }
  else {
    local_70 = *plVar4;
    local_80 = (long *)*puVar3;
  }
  local_78 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar1 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
LAB_00116463:
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const std::string file_name(file == nullptr ? kUnknownFile : file);

  if (line < 0) {
    return file_name + ":";
  }
#ifdef _MSC_VER
  return file_name + "(" + StreamableToString(line) + "):";
#else
  return file_name + ":" + StreamableToString(line) + ":";
#endif  // _MSC_VER
}